

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_func_begin(string *func_name)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  string *func_name_local;
  
  std::ios_base::setf((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),_S_right);
  _Var2 = std::setw(0x1e);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  _Var1 = std::setfill<char>('#');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  poVar3 = std::operator<<(poVar3," begin ");
  poVar3 = std::operator<<(poVar3,(string *)func_name);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,"############################");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_func_begin(const std::string& func_name) {
    std::cout.setf(std::ios::right);
    std::cout << std::setw(30) << std::setfill('#') << " begin " << func_name
              << " "
              << "############################" << std::endl;
}